

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O2

MaybeResult<wasm::Ok> *
wasm::WATParser::instr<wasm::WATParser::ParseDefsCtx>
          (MaybeResult<wasm::Ok> *__return_storage_ptr__,ParseDefsCtx *ctx)

{
  vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_> *__x;
  __optional_eq_t<std::basic_string_view<char>,_std::basic_string_view<char>_> _Var1;
  basic_string_view<char,_std::char_traits<char>_> local_b0;
  basic_string_view<char,_std::char_traits<char>_> local_a0;
  basic_string_view<char,_std::char_traits<char>_> local_90;
  basic_string_view<char,_std::char_traits<char>_> local_80;
  basic_string_view<char,_std::char_traits<char>_> local_70;
  basic_string_view<char,_std::char_traits<char>_> local_60;
  basic_string_view<char,_std::char_traits<char>_> local_50;
  undefined1 local_40 [8];
  optional<std::basic_string_view<char,_std::char_traits<char>_>_> keyword;
  
  Lexer::peekKeyword((optional<std::basic_string_view<char,_std::char_traits<char>_>_> *)local_40,
                     &ctx->in);
  if (keyword.
      super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>.
      _M_payload.
      super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
      _M_payload._8_1_ == '\x01') {
    local_b0._M_len = 3;
    local_b0._M_str = "end";
    _Var1 = std::operator==((optional<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                            local_40,&local_b0);
    if (_Var1) goto LAB_00c59ea1;
    local_a0._M_len = 4;
    local_a0._M_str = "then";
    _Var1 = std::operator==((optional<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                            local_40,&local_a0);
    if (_Var1) goto LAB_00c59ea1;
    local_90._M_len = 4;
    local_90._M_str = "else";
    _Var1 = std::operator==((optional<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                            local_40,&local_90);
    if (_Var1) goto LAB_00c59ea1;
    local_80._M_len = 5;
    local_80._M_str = "catch";
    _Var1 = std::operator==((optional<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                            local_40,&local_80);
    if (_Var1) goto LAB_00c59ea1;
    local_70._M_len = 9;
    local_70._M_str = "catch_all";
    _Var1 = std::operator==((optional<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                            local_40,&local_70);
    if (_Var1) goto LAB_00c59ea1;
    local_60._M_len = 8;
    local_60._M_str = "delegate";
    _Var1 = std::operator==((optional<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                            local_40,&local_60);
    if (_Var1) goto LAB_00c59ea1;
    local_50._M_len = 3;
    local_50._M_str = "ref";
    _Var1 = std::operator==((optional<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                            local_40,&local_50);
    if (_Var1) goto LAB_00c59ea1;
  }
  __x = &(ctx->in).annotations;
  std::vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>::vector
            ((vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_> *)
             local_40,__x);
  blockinstr<wasm::WATParser::ParseDefsCtx>
            (__return_storage_ptr__,ctx,
             (vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_> *)
             local_40);
  std::_Vector_base<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>::
  ~_Vector_base((_Vector_base<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
                 *)local_40);
  if (*(__index_type *)
       ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20) != '\x01') {
    return __return_storage_ptr__;
  }
  std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err>::
  ~_Variant_storage((_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err> *)
                    __return_storage_ptr__);
  std::vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>::vector
            ((vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_> *)
             local_40,__x);
  plaininstr<wasm::WATParser::ParseDefsCtx>
            (__return_storage_ptr__,ctx,
             (vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_> *)
             local_40);
  std::_Vector_base<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>::
  ~_Vector_base((_Vector_base<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
                 *)local_40);
  if (*(__index_type *)
       ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20) != '\x01') {
    return __return_storage_ptr__;
  }
  std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err>::
  ~_Variant_storage((_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err> *)
                    __return_storage_ptr__);
LAB_00c59ea1:
  *(__index_type *)
   ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
           super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
           super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
           super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
           super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
           super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20) = '\x01';
  return __return_storage_ptr__;
}

Assistant:

MaybeResult<> instr(Ctx& ctx) {
  // Check for valid strings that are not instructions.
  if (auto keyword = ctx.in.peekKeyword()) {
    if (keyword == "end"sv || keyword == "then"sv || keyword == "else"sv ||
        keyword == "catch"sv || keyword == "catch_all"sv ||
        keyword == "delegate"sv || keyword == "ref"sv) {
      return {};
    }
  }
  if (auto inst = blockinstr(ctx, ctx.in.getAnnotations())) {
    return inst;
  }
  if (auto inst = plaininstr(ctx, ctx.in.getAnnotations())) {
    return inst;
  }
  // TODO: Handle folded plain instructions as well.
  return {};
}